

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

Type * __thiscall slang::ast::MultiPortSymbol::getType(MultiPortSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *this_00;
  Compilation *this_01;
  pointer ppPVar2;
  size_t sVar3;
  PortSymbol *this_02;
  bitmask<slang::ast::IntegralFlags> bVar4;
  bool bVar5;
  bitwidth_t bVar6;
  Type *pTVar7;
  Diagnostic *diag;
  bitmask<slang::ast::IntegralFlags> flags;
  bitwidth_t width;
  long lVar8;
  LookupLocation LVar9;
  SourceRange range;
  ASTContext context;
  ASTContext local_68;
  
  if (this->type != (Type *)0x0) {
    return this->type;
  }
  pSVar1 = (this->super_Symbol).parentScope;
  this_00 = (this->super_Symbol).originatingSyntax;
  this_01 = pSVar1->compilation;
  LVar9 = LookupLocation::before(&this->super_Symbol);
  local_68.lookupIndex = LVar9.index;
  local_68.flags.m_bits = 0x20;
  local_68.instanceOrProc = (Symbol *)0x0;
  local_68.firstTempVar = (TempVarSymbol *)0x0;
  local_68.randomizeDetails = (RandomizeDetails *)0x0;
  local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
  ppPVar2 = (this->ports)._M_ptr;
  sVar3 = (this->ports)._M_extent._M_extent_value;
  lVar8 = 0;
  flags.m_bits = '\0';
  width = 0;
  local_68.scope.ptr = pSVar1;
  do {
    if (sVar3 << 3 == lVar8) {
      if (width == 0) {
        pTVar7 = this_01->errorType;
      }
      else {
        pTVar7 = Compilation::getType(this_01,width,flags);
      }
LAB_0032e38e:
      this->type = pTVar7;
      return pTVar7;
    }
    this_02 = *(PortSymbol **)((long)ppPVar2 + lVar8);
    pTVar7 = PortSymbol::getType(this_02);
    bVar5 = Type::isError(pTVar7);
    if (bVar5) {
LAB_0032e37e:
      pTVar7 = this_01->errorType;
      goto LAB_0032e38e;
    }
    bVar5 = Type::isUntypedType(pTVar7);
    if (bVar5) goto LAB_0032e37e;
    bVar5 = Type::isIntegral(pTVar7);
    if (!bVar5) {
      diag = ASTContext::addDiag(&local_68,(DiagCode)0x210007,this_02->externalLoc);
      ast::operator<<(diag,pTVar7);
      goto LAB_0032e37e;
    }
    bVar6 = Type::getBitWidth(pTVar7);
    width = width + bVar6;
    range = slang::syntax::SyntaxNode::sourceRange(this_00);
    bVar5 = ASTContext::requireValidBitWidth(&local_68,width,range);
    if (!bVar5) goto LAB_0032e37e;
    bVar5 = Type::isFourState(pTVar7);
    bVar4.m_bits = '\x02';
    if (!bVar5) {
      bVar4.m_bits = flags.m_bits;
    }
    flags.m_bits = bVar4.m_bits;
    lVar8 = lVar8 + 8;
  } while( true );
}

Assistant:

const Type& MultiPortSymbol::getType() const {
    if (type)
        return *type;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    auto& comp = scope->getCompilation();

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);
    bitwidth_t totalWidth = 0;
    bitmask<IntegralFlags> flags;

    for (auto port : ports) {
        auto& t = port->getType();
        if (t.isError() || t.isUntypedType()) {
            type = &comp.getErrorType();
            return *type;
        }

        if (!t.isIntegral()) {
            context.addDiag(diag::BadConcatExpression, port->externalLoc) << t;
            type = &comp.getErrorType();
            return *type;
        }

        totalWidth += t.getBitWidth();

        if (!context.requireValidBitWidth(totalWidth, syntax->sourceRange())) {
            type = &comp.getErrorType();
            return *type;
        }

        if (t.isFourState())
            flags |= IntegralFlags::FourState;
    }

    if (totalWidth == 0) {
        type = &comp.getErrorType();
        return *type;
    }

    type = &comp.getType(totalWidth, flags);
    return *type;
}